

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

int find_symbol(Grammar *g,char *s,char *e,int kind)

{
  Term *pTVar1;
  int iVar2;
  ushort **ppuVar3;
  size_t sVar4;
  Production *pPVar5;
  size_t __n;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  char *__s;
  uint uVar9;
  int local_3c;
  
  bVar6 = *s;
  if (bVar6 != 0) {
    ppuVar3 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar3 + (ulong)bVar6 * 2 + 1) & 0x20) == 0) break;
      bVar6 = s[1];
      s = s + 1;
    } while (bVar6 != 0);
  }
  uVar7 = 0xffffffff;
  if (s < e) {
    if (kind == 1) {
      pPVar5 = lookup_production(g,s,(int)e - (int)s);
      if (pPVar5 != (Production *)0x0) {
        uVar7 = pPVar5->index;
      }
    }
    else if ((kind == 4) && (uVar9 = (g->terminals).n, uVar9 != 0)) {
      __n = (long)e - (long)s;
      local_3c = -1;
      uVar8 = 0;
      do {
        pTVar1 = (g->terminals).v[uVar8];
        if (pTVar1->kind == TERM_STRING) {
          __s = pTVar1->term_name;
          if (__s == (char *)0x0) {
            if (__n == (long)pTVar1->string_len) {
              __s = pTVar1->string;
              goto LAB_001381f3;
            }
          }
          else {
            sVar4 = strlen(__s);
            if (sVar4 == __n) {
LAB_001381f3:
              iVar2 = strncmp(s,__s,__n);
              if (iVar2 == 0) {
                if (local_3c < 1) {
                  local_3c = (int)uVar8;
                }
                else {
                  d_fail("attempt to find symbol for non-unique string \'%s\'\n",pTVar1->string);
                  uVar9 = (g->terminals).n;
                }
              }
            }
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar9);
      if (local_3c < 1) {
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = local_3c + (g->productions).n;
      }
    }
  }
  return uVar7;
}

Assistant:

static int find_symbol(Grammar *g, char *s, char *e, int kind) {
  while (*s && isspace_(*s)) s++;
  if (e > s) {
    if (kind == D_SYMBOL_NTERM) {
      Production *p;
      if ((p = lookup_production(g, s, e - s))) return p->index;
    } else if (kind == D_SYMBOL_STRING) {
      uint i;
      int found = -1;
      for (i = 0; i < g->terminals.n; i++)
        if (g->terminals.v[i]->kind == TERM_STRING &&
            ((g->terminals.v[i]->term_name && strlen(g->terminals.v[i]->term_name) == (size_t)(e - s) &&
              !strncmp(s, g->terminals.v[i]->term_name, e - s)) ||
             (!g->terminals.v[i]->term_name && g->terminals.v[i]->string_len == (e - s) &&
              !strncmp(s, g->terminals.v[i]->string, e - s)))) {
          if (found > 0) {
            d_fail("attempt to find symbol for non-unique string '%s'\n", g->terminals.v[i]->string);
          } else
            found = i;
        }
      if (found > 0) return found + g->productions.n;
    }
  }
  return -1;
}